

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_progress_bar_display.cpp
# Opt level: O0

void __thiscall
duckdb::TerminalProgressBarDisplay::PrintProgressInternal
          (TerminalProgressBarDisplay *this,int32_t percentage)

{
  ulong uVar1;
  int in_ESI;
  long in_RDI;
  double dVar2;
  undefined1 auVar3 [16];
  idx_t index;
  idx_t i;
  double blocks_to_draw;
  string result;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  ulong uVar4;
  OutputStream stream;
  string local_88 [32];
  string local_68 [20];
  int in_stack_ffffffffffffffac;
  string local_30 [36];
  int local_c;
  
  this_00 = local_30;
  local_c = in_ESI;
  ::std::__cxx11::string::string(this_00);
  dVar2 = ((double)local_c / 100.0) * 60.0;
  ::std::__cxx11::string::operator=(this_00,"\r");
  if (local_c < 100) {
    ::std::__cxx11::string::operator+=(local_30," ");
  }
  if (local_c < 10) {
    ::std::__cxx11::string::operator+=(local_30," ");
  }
  ::std::__cxx11::to_string(in_stack_ffffffffffffffac);
  ::std::operator+(in_stack_ffffffffffffff68,(char *)this_00);
  ::std::__cxx11::string::operator+=(local_30,local_68);
  ::std::__cxx11::string::~string(local_68);
  ::std::__cxx11::string::~string(local_88);
  ::std::__cxx11::string::operator+=(local_30," ");
  ::std::__cxx11::string::operator+=(local_30,*(char **)(in_RDI + 0x28));
  for (uVar4 = 0;
      uVar4 < (ulong)((long)dVar2 | (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f);
      uVar4 = uVar4 + 1) {
    ::std::__cxx11::string::operator+=(local_30,*(char **)(in_RDI + 0x20));
  }
  if (uVar4 < 0x3c) {
    uVar1 = (long)dVar2 | (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f;
    auVar3._8_4_ = (int)(uVar1 >> 0x20);
    auVar3._0_8_ = uVar1;
    auVar3._12_4_ = 0x45300000;
    dVar2 = (dVar2 - ((auVar3._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0))) * 8.0;
    uVar1 = (ulong)dVar2;
    in_stack_ffffffffffffff68 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (uVar1 | (long)(dVar2 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7 <
        in_stack_ffffffffffffff68) {
      in_stack_ffffffffffffff68 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7;
    }
    ::std::__cxx11::string::operator+=
              (local_30,*(char **)(*(long *)(in_RDI + 0x18) + (long)in_stack_ffffffffffffff68 * 8));
    uVar4 = uVar4 + 1;
  }
  for (; uVar4 < 0x3c; uVar4 = uVar4 + 1) {
    ::std::__cxx11::string::operator+=(local_30,*(char **)(in_RDI + 0x10));
  }
  ::std::__cxx11::string::operator+=(local_30,*(char **)(in_RDI + 0x30));
  stream = (OutputStream)(uVar4 >> 0x38);
  ::std::__cxx11::string::operator+=(local_30," ");
  Printer::RawPrint(stream,(string *)in_stack_ffffffffffffff68);
  ::std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void TerminalProgressBarDisplay::PrintProgressInternal(int32_t percentage) {
	string result;
	// we divide the number of blocks by the percentage
	// 0%   = 0
	// 100% = PROGRESS_BAR_WIDTH
	// the percentage determines how many blocks we need to draw
	double blocks_to_draw = PROGRESS_BAR_WIDTH * (percentage / 100.0);
	// because of the power of unicode, we can also draw partial blocks

	// render the percentage with some padding to ensure everything stays nicely aligned
	result = "\r";
	if (percentage < 100) {
		result += " ";
	}
	if (percentage < 10) {
		result += " ";
	}
	result += to_string(percentage) + "%";
	result += " ";
	result += PROGRESS_START;
	idx_t i;
	for (i = 0; i < idx_t(blocks_to_draw); i++) {
		result += PROGRESS_BLOCK;
	}
	if (i < PROGRESS_BAR_WIDTH) {
		// print a partial block based on the percentage of the progress bar remaining
		idx_t index = idx_t((blocks_to_draw - static_cast<double>(idx_t(blocks_to_draw))) * PARTIAL_BLOCK_COUNT);
		if (index >= PARTIAL_BLOCK_COUNT) {
			index = PARTIAL_BLOCK_COUNT - 1;
		}
		result += PROGRESS_PARTIAL[index];
		i++;
	}
	for (; i < PROGRESS_BAR_WIDTH; i++) {
		result += PROGRESS_EMPTY;
	}
	result += PROGRESS_END;
	result += " ";

	Printer::RawPrint(OutputStream::STREAM_STDOUT, result);
}